

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SyntaxKind SVar1;
  double value;
  _Optional_payload_base<int> _Var2;
  ulong uVar3;
  SourceRange SVar4;
  Token token;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  byte local_3b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  SyntaxNode *pSStack_30;
  
  SVar1 = (expr->super_SyntaxNode).kind;
  if (SVar1 == NumberPragmaExpression) {
    Token::intValue((Token *)&local_38);
    _Var2 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)&local_38);
    uVar3 = 0x100000000;
    if (((ulong)_Var2 & 0x180000000) != 0x100000000) {
      SVar4 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
      addDiag(this,(DiagCode)0x240004,SVar4);
      uVar3 = 0;
    }
    local_48 = local_38;
    if (((uint)pSStack_30 < 0x41) && (((ulong)pSStack_30 & 0x10000000000) == 0)) goto LAB_0028c9ca;
  }
  else {
    if (SVar1 != SimplePragmaExpression) {
LAB_0028c8b1:
      SVar4 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
      addDiag(this,(DiagCode)0x240004,SVar4);
      _Var2._M_payload = (_Storage<int,_true>)0x0;
      _Var2._M_engaged = false;
      _Var2._5_3_ = 0;
      uVar3 = 0;
      goto LAB_0028c9ca;
    }
    local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
               ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(expr + 1))->val;
    pSStack_30 = expr[1].super_SyntaxNode.parent;
    if (local_38.val._0_2_ == 8) {
      value = Token::realValue((Token *)&local_38);
      SVInt::fromDouble((SVInt *)&local_48,0x20,value,true,true);
      _Var2 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)&local_48);
      uVar3 = 0x100000000;
      if (((ulong)_Var2 & 0x180000000) != 0x100000000) {
        SVar4 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
        addDiag(this,(DiagCode)0x240004,SVar4);
LAB_0028c9ab:
        uVar3 = 0;
      }
    }
    else {
      if (local_38.val._0_2_ != 5) goto LAB_0028c8b1;
      Token::intValue((Token *)&local_48);
      _Var2 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)&local_48);
      uVar3 = 0x100000000;
      if (((ulong)_Var2 & 0x180000000) != 0x100000000) {
        SVar4 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
        addDiag(this,(DiagCode)0x240004,SVar4);
        goto LAB_0028c9ab;
      }
    }
    if ((local_40 < 0x41) && ((local_3b & 1) == 0)) goto LAB_0028c9ca;
  }
  if ((void *)local_48.val != (void *)0x0) {
    operator_delete__(local_48.pVal);
  }
LAB_0028c9ca:
  return (optional<unsigned_int>)((ulong)_Var2 & 0xffffffff | uVar3);
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}